

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::SetLanguageEnabledFlag(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  cmState::SetLanguageEnabled(this->CMakeInstance->State,l);
  FillExtensionToLanguageMap(this,l,mf);
  return;
}

Assistant:

void cmGlobalGenerator::SetLanguageEnabledFlag(const std::string& l,
                                               cmMakefile* mf)
{
  this->CMakeInstance->GetState()->SetLanguageEnabled(l);

  // Fill the language-to-extension map with the current variable
  // settings to make sure it is available for the try_compile()
  // command source file signature.  In SetLanguageEnabledMaps this
  // will be done again to account for any compiler- or
  // platform-specific entries.
  this->FillExtensionToLanguageMap(l, mf);
}